

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdown.cpp
# Opt level: O1

ssize_t __thiscall markdown::Document::read(Document *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  element_type *peVar2;
  long lVar3;
  bool bVar4;
  undefined8 in_RAX;
  undefined7 uVar8;
  __ssize_t _Var5;
  BlankLine *p;
  _List_node_base *p_Var6;
  RawText *p_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  undefined4 in_register_00000034;
  TokenGroup tgt;
  string line;
  shared_ptr<markdown::Token> local_88;
  _List_base<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
  local_78;
  string local_60;
  long local_40;
  _func_int **local_38;
  
  bVar1 = this->mProcessed;
  uVar8 = (undefined7)((ulong)in_RAX >> 8);
  if (bVar1 == false) {
    peVar2 = (this->mTokenContainer).px;
    if (peVar2 == (element_type *)0x0) {
      local_40 = 0;
    }
    else {
      __nbytes = 0;
      local_40 = __dynamic_cast(peVar2,&Token::typeinfo,&token::Container::typeinfo);
    }
    if (local_40 == 0) {
      __assert_fail("tokens!=0",
                    "/workspace/llm4binary/github/license_c_cmakelists/sevenjay[P]cpp-markdown/src/markdown.cpp"
                    ,0x294,"bool markdown::Document::read(std::istream &)");
    }
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    local_60._M_string_length = 0;
    local_60.field_2._M_local_buf[0] = '\0';
    local_78._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_78;
    local_78._M_impl._M_node._M_size = 0;
    local_38 = (_func_int **)&PTR__TextHolder_00168388;
    local_78._M_impl._M_node.super__List_node_base._M_prev =
         local_78._M_impl._M_node.super__List_node_base._M_next;
    while( true ) {
      _Var5 = _getline(this,(char **)CONCAT44(in_register_00000034,__fd),(size_t *)&local_60,
                       (FILE *)__nbytes);
      lVar3 = local_40;
      if ((char)_Var5 == '\0') break;
      bVar4 = anon_unknown.dwarf_2de61::isBlankLine(&local_60);
      if (bVar4) {
        p = (BlankLine *)operator_new(0x30);
        (p->super_TextHolder).super_Token._vptr_Token = (_func_int **)&PTR__TextHolder_001682d0;
        (p->super_TextHolder).mText._M_dataplus._M_p = (pointer)&(p->super_TextHolder).mText.field_2
        ;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&(p->super_TextHolder).mText,local_60._M_dataplus._M_p,
                   local_60._M_dataplus._M_p + local_60._M_string_length);
        (p->super_TextHolder).mCanContainMarkup = false;
        (p->super_TextHolder).mEncodingFlags = 0;
        (p->super_TextHolder).super_Token._vptr_Token = (_func_int **)&PTR__TextHolder_00166be0;
        boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::BlankLine>(&local_88,p);
        p_Var6 = (_List_node_base *)operator_new(0x20);
      }
      else {
        p_00 = (RawText *)operator_new(0x30);
        (p_00->super_TextHolder).super_Token._vptr_Token = (_func_int **)&PTR__TextHolder_001682d0;
        (p_00->super_TextHolder).mText._M_dataplus._M_p =
             (pointer)&(p_00->super_TextHolder).mText.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&(p_00->super_TextHolder).mText,local_60._M_dataplus._M_p,
                   local_60._M_dataplus._M_p + local_60._M_string_length);
        (p_00->super_TextHolder).mCanContainMarkup = true;
        (p_00->super_TextHolder).mEncodingFlags = 0xd;
        (p_00->super_TextHolder).super_Token._vptr_Token = local_38;
        boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::RawText>(&local_88,p_00);
        p_Var6 = (_List_node_base *)operator_new(0x20);
      }
      __nbytes = (size_t)local_88.pn.pi_;
      p_Var6[1]._M_next = (_List_node_base *)local_88.px;
      p_Var6[1]._M_prev = (_List_node_base *)0x0;
      local_88.pn.pi_ = (sp_counted_base *)0x0;
      p_Var6[1]._M_prev = (_List_node_base *)__nbytes;
      local_88.px = (element_type *)0x0;
      std::__detail::_List_node_base::_M_hook(p_Var6);
      local_78._M_impl._M_node._M_size = local_78._M_impl._M_node._M_size + 1;
      boost::detail::shared_count::~shared_count(&local_88.pn);
    }
    if (local_78._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_78) {
      std::__detail::_List_node_base::_M_transfer
                ((_List_node_base *)(local_40 + 8),
                 local_78._M_impl._M_node.super__List_node_base._M_next);
      *(long *)(lVar3 + 0x18) = *(long *)(lVar3 + 0x18) + local_78._M_impl._M_node._M_size;
      local_78._M_impl._M_node._M_size = 0;
    }
    std::__cxx11::
    _List_base<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
    ::_M_clear(&local_78);
    paVar7 = &local_60.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar7) {
      operator_delete(local_60._M_dataplus._M_p,
                      CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                               local_60.field_2._M_local_buf[0]) + 1);
      paVar7 = extraout_RAX;
    }
    uVar8 = (undefined7)((ulong)paVar7 >> 8);
  }
  return CONCAT71(uVar8,bVar1) ^ 1;
}

Assistant:

bool Document::read(std::istream& in) {
	if (mProcessed) return false;

	token::Container *tokens=dynamic_cast<token::Container*>(mTokenContainer.get());
	assert(tokens!=0);

	std::string line;
	TokenGroup tgt;
	while (_getline(in, line)) {
		if (isBlankLine(line)) {
			tgt.push_back(TokenPtr(new token::BlankLine(line)));
		} else {
			tgt.push_back(TokenPtr(new token::RawText(line)));
		}
	}
	tokens->appendSubtokens(tgt);

	return true;
}